

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateGlobalStateFunctionDeclarations
          (FileGenerator *this,Printer *printer)

{
  string *filename;
  ulong uVar1;
  bool bVar2;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  filename = FileDescriptor::name_abi_cxx11_(this->file_);
  FileLevelNamespace(&local_38,filename);
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  }
  else {
    std::operator+(&local_58,&(this->options_).dllexport_decl," ");
  }
  io::Printer::Print(printer,
                     "\nnamespace $file_namespace$ {\n// Internal implementation detail -- do not call these.\nstruct $dllexport_decl$TableStruct {\n  static const ::google::protobuf::internal::ParseTableField entries[];\n  static const ::google::protobuf::internal::AuxillaryParseTableField aux[];\n  static const ::google::protobuf::internal::ParseTable schema[];\n  static const ::google::protobuf::uint32 offsets[];\n  static void InitDefaultsImpl();\n  static void Shutdown();\n};\nvoid $dllexport_decl$AddDescriptors();\nvoid $dllexport_decl$InitDefaults();\n}  // namespace $file_namespace$\n"
                     ,"file_namespace",&local_38,"dllexport_decl",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar2) {
    std::allocator<char>::~allocator(&local_59);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FileGenerator::GenerateGlobalStateFunctionDeclarations(
    io::Printer* printer) {
  // Forward-declare the AddDescriptors, AssignDescriptors, and ShutdownFile
  // functions, so that we can declare them to be friends of each class.
  printer->Print(
      "\n"
      "namespace $file_namespace$ {\n"
      "// Internal implementation detail -- do not call these.\n"
      "struct $dllexport_decl$TableStruct {\n"
      "  static const ::google::protobuf::internal::ParseTableField entries[];\n"
      "  static const ::google::protobuf::internal::AuxillaryParseTableField aux[];\n"
      "  static const ::google::protobuf::internal::ParseTable schema[];\n"
      "  static const ::google::protobuf::uint32 offsets[];\n"
      // The following function(s) need to be able to access private members of
      // the messages defined in the file. So we make them static members.
      // This is the internal implementation of InitDefaults. It should only
      // be called by InitDefaults which makes sure it will be called only once.
      "  static void InitDefaultsImpl();\n"
      "  static void Shutdown();\n"
      "};\n"
      "void $dllexport_decl$AddDescriptors();\n"
      "void $dllexport_decl$InitDefaults();\n"
      "}  // namespace $file_namespace$\n",
      "file_namespace", FileLevelNamespace(file_->name()), "dllexport_decl",
      options_.dllexport_decl.empty() ? "" : options_.dllexport_decl + " ");
}